

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_tests.cpp
# Opt level: O2

void __thiscall
syntax_tests::iu_SyntaxTest_x_iutest_x_StrLn_Test::iu_SyntaxTest_x_iutest_x_StrLn_Test
          (iu_SyntaxTest_x_iutest_x_StrLn_Test *this)

{
  iutest::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_003950d8;
  return;
}

Assistant:

IUTEST(SyntaxTest, StrLn)
{
    const char test[] = "test";
    if( int len = 4 )
        IUTEST_ASSERT_STRLNEQ(len, test) << len;
    if( int len = 4 )
        IUTEST_EXPECT_STRLNEQ(len, test) << len;
    if( int len = 4 )
        IUTEST_INFORM_STRLNEQ(len, test) << len;
    if( int len = 4 )
        IUTEST_ASSUME_STRLNEQ(len, test) << len;
}